

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Qiniu_Error
Qiniu_Io_PutBuffer(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,char *buf,
                  size_t fsize,Qiniu_Io_PutExtra *extra)

{
  Qiniu_Bool QVar1;
  Qiniu_Error QVar2;
  undefined4 uStack_74;
  undefined1 local_68 [8];
  Qiniu_Io_form form;
  char *bucketName;
  char *accessKey;
  size_t fsize_local;
  char *buf_local;
  char *key_local;
  char *uptoken_local;
  Qiniu_Io_PutRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  self_local = (Qiniu_Client *)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
  bucketName = (char *)0x0;
  form.lastptr = (curl_httppost *)0x0;
  accessKey = (char *)fsize;
  fsize_local = (size_t)buf;
  buf_local = key;
  key_local = uptoken;
  uptoken_local = (char *)ret;
  ret_local = (Qiniu_Io_PutRet *)self;
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&bucketName,(char **)&form.lastptr);
  if (QVar1 == 0) {
    self_local = (Qiniu_Client *)0x190;
    err._0_8_ = anon_var_dwarf_4a044;
  }
  else {
    Qiniu_Io_form_init((Qiniu_Io_form *)local_68,key_local,buf_local,&extra);
    if (buf_local == (char *)0x0) {
      buf_local = "";
    }
    curl_formadd(local_68,&form,1,"file",0xb,buf_local,0xc,fsize_local,0xd,accessKey,0x11);
    QVar2 = Qiniu_Io_call((Qiniu_Client *)ret_local,bucketName,(char *)form.lastptr,
                          (Qiniu_Io_PutRet *)uptoken_local,(curl_httppost *)local_68,extra);
    err._0_8_ = QVar2.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_74,QVar2.code);
    Qiniu_Free(bucketName);
    Qiniu_Free(form.lastptr);
  }
  QVar2._0_8_ = (ulong)self_local & 0xffffffff;
  QVar2.message = (char *)err._0_8_;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_Io_PutBuffer(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key, const char *buf, size_t fsize, Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    const char *accessKey = NULL, *bucketName = NULL;
    Qiniu_Io_form form;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    if (key == NULL)
    {
        // Use an empty string instead of the NULL pointer to prevent the curl lib from crashing
        // when read it.
        // **NOTICE**: The magic variable $(filename) will be set as empty string.
        key = "";
    }

    curl_formadd(
        &form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file",
        CURLFORM_BUFFER, key, CURLFORM_BUFFERPTR, buf, CURLFORM_BUFFERLENGTH, fsize, CURLFORM_END);
    err = Qiniu_Io_call(self, accessKey, bucketName, ret, form.formpost, extra);

    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}